

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_escaped_characters(string *str)

{
  bool bVar1;
  reference pcVar2;
  difference_type dVar3;
  invalid_argument *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_RDI;
  uint32_t res_1;
  int ii_1;
  uint32_t mplier_1;
  uint32_t code_1;
  uint32_t res;
  int ii;
  uint32_t mplier;
  uint32_t code;
  size_type ecloc;
  const_iterator loc;
  string *out;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffda8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__rhs_00;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  uint32_t in_stack_fffffffffffffe0c;
  string *in_stack_fffffffffffffe10;
  string local_190 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  undefined1 local_161;
  string local_160 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  uint32_t local_134;
  int local_130;
  uint local_12c;
  int local_128;
  undefined1 local_121;
  string local_120 [32];
  undefined8 local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined1 local_e9;
  string local_e8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  uint32_t local_bc;
  int local_b8;
  uint local_b4;
  int local_b0;
  undefined1 local_a9;
  string local_a8 [32];
  undefined8 local_88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_70;
  undefined1 local_61;
  string local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [3];
  undefined1 local_11;
  
  local_11 = 0;
  __rhs_00 = in_RDI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__rhs_00);
  local_30[0]._M_current = (char *)::std::__cxx11::string::begin();
  do {
    local_38 = ::std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    if (!bVar1) {
      return in_RDI;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_30);
    if (*pcVar2 == '\\') {
      local_40 = ::std::__cxx11::string::end();
      dVar3 = __gnu_cxx::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (dVar3 < 2) {
        local_61 = 1;
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         __rhs_00);
        ::std::invalid_argument::invalid_argument(piVar4,local_60);
        local_61 = 0;
        __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                    ::std::invalid_argument::~invalid_argument);
      }
      local_78 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_78);
      local_70 = ::std::__cxx11::string::find_first_of('8',(ulong)(uint)(int)*pcVar2);
      if (local_70 == -1) {
        local_80 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0)
        ;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_80);
        if (*pcVar2 == 'u') {
          local_88 = ::std::__cxx11::string::end();
          dVar3 = __gnu_cxx::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          if (dVar3 < 6) {
            local_a9 = 1;
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                             __rhs_00);
            ::std::invalid_argument::invalid_argument(piVar4,local_a8);
            local_a9 = 0;
            __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
          local_b0 = 0;
          local_b4 = 0x1000;
          for (local_b8 = 2; local_b8 < 6; local_b8 = local_b8 + 1) {
            local_c8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(in_stack_fffffffffffffdb8,
                                   (difference_type)in_stack_fffffffffffffdb0);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_c8);
            local_bc = hexConvert(*pcVar2);
            if (0xf < local_bc) {
              local_e9 = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                               ,__rhs_00);
              ::std::invalid_argument::invalid_argument(piVar4,local_e8);
              local_e9 = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            local_b0 = local_bc * local_b4 + local_b0;
            local_b4 = local_b4 >> 4;
          }
          append_codepoint(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(local_30,5);
        }
        else {
          local_f8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_fffffffffffffdb8,
                                 (difference_type)in_stack_fffffffffffffdb0);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_f8);
          if (*pcVar2 == 'U') {
            local_100 = ::std::__cxx11::string::end();
            dVar3 = __gnu_cxx::operator-(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
            if (dVar3 < 10) {
              local_121 = 1;
              piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
              ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                               ,__rhs_00);
              ::std::invalid_argument::invalid_argument(piVar4,local_120);
              local_121 = 0;
              __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            local_128 = 0;
            local_12c = 0x10000000;
            for (local_130 = 2; local_130 < 10; local_130 = local_130 + 1) {
              local_140 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(in_stack_fffffffffffffdb8,
                                      (difference_type)in_stack_fffffffffffffdb0);
              pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_140);
              local_134 = hexConvert(*pcVar2);
              if (0xf < local_134) {
                local_161 = 1;
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                ::std::operator+((char *)CONCAT17(in_stack_fffffffffffffdff,
                                                  in_stack_fffffffffffffdf8),__rhs_00);
                ::std::invalid_argument::invalid_argument(piVar4,local_160);
                local_161 = 0;
                __cxa_throw(piVar4,&::std::invalid_argument::typeinfo,
                            ::std::invalid_argument::~invalid_argument);
              }
              local_128 = local_134 * local_12c + local_128;
              local_12c = local_12c >> 4;
            }
            append_codepoint(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+=(local_30,9);
          }
          else {
            local_170 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(in_stack_fffffffffffffdb8,
                                    (difference_type)in_stack_fffffffffffffdb0);
            pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_170);
            if (*pcVar2 != '0') {
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x10);
              __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xfffffffffffffe0f;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffffe10,"unrecognized escape sequence \\",
                         (allocator *)__lhs);
              local_200 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)__lhs,(difference_type)__rhs);
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_200);
              ::std::operator+(__lhs,(char)((ulong)__rhs >> 0x38));
              ::std::operator+(__lhs,(char *)__rhs);
              ::std::operator+(__lhs,__rhs);
              ::std::invalid_argument::invalid_argument((invalid_argument *)__rhs,local_190);
              __cxa_throw(__rhs,&::std::invalid_argument::typeinfo,
                          ::std::invalid_argument::~invalid_argument);
            }
            ::std::__cxx11::string::push_back((char)__rhs_00);
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(local_30);
          }
        }
      }
      else {
        ::std::__cxx11::string::operator[](0x1b7918);
        ::std::__cxx11::string::push_back((char)__rhs_00);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_30);
      }
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_30);
      ::std::__cxx11::string::push_back((char)__rhs_00);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

CLI11_INLINE std::string remove_escaped_characters(const std::string &str) {

    std::string out;
    out.reserve(str.size());
    for(auto loc = str.begin(); loc < str.end(); ++loc) {
        if(*loc == '\\') {
            if(str.end() - loc < 2) {
                throw std::invalid_argument("invalid escape sequence " + str);
            }
            auto ecloc = escapedCharsCode.find_first_of(*(loc + 1));
            if(ecloc != std::string::npos) {
                out.push_back(escapedChars[ecloc]);
                ++loc;
            } else if(*(loc + 1) == 'u') {
                // must have 4 hex characters
                if(str.end() - loc < 6) {
                    throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16};
                for(int ii = 2; ii < 6; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 4 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 5;
            } else if(*(loc + 1) == 'U') {
                // must have 8 hex characters
                if(str.end() - loc < 10) {
                    throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                }
                std::uint32_t code{0};
                std::uint32_t mplier{16 * 16 * 16 * 16 * 16 * 16 * 16};
                for(int ii = 2; ii < 10; ++ii) {
                    std::uint32_t res = hexConvert(*(loc + ii));
                    if(res > 0x0F) {
                        throw std::invalid_argument("unicode sequence must have 8 hex codes " + str);
                    }
                    code += res * mplier;
                    mplier = mplier / 16;
                }
                append_codepoint(out, code);
                loc += 9;
            } else if(*(loc + 1) == '0') {
                out.push_back('\0');
                ++loc;
            } else {
                throw std::invalid_argument(std::string("unrecognized escape sequence \\") + *(loc + 1) + " in " + str);
            }
        } else {
            out.push_back(*loc);
        }
    }
    return out;
}